

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void err_argmsg(lua_State *L,int narg,char *msg)

{
  char *pcVar1;
  undefined8 in_RDX;
  uint in_ESI;
  lua_State *in_RDI;
  char *ftype;
  char *fname;
  undefined4 in_stack_00000018;
  undefined4 in_stack_fffffffffffffff0;
  
  pcVar1 = lj_debug_funcname((lua_State *)CONCAT44(narg,in_stack_00000018),(cTValue *)msg,
                             (char **)fname);
  if (((int)in_ESI < 0) && (-10000 < (int)in_ESI)) {
    in_ESI = (int)((long)in_RDI->top - (long)in_RDI->base >> 3) + in_ESI + 1;
  }
  if (((pcVar1 == (char *)0x0) || (pcVar1[3] != 'h')) || (in_ESI = in_ESI - 1, in_ESI != 0)) {
    pcVar1 = lj_strfmt_pushf(in_RDI,lj_err_allmsg + 0x1e7,(ulong)in_ESI,"?",in_RDX);
  }
  else {
    pcVar1 = lj_strfmt_pushf(in_RDI,lj_err_allmsg + 0x1c9,"?",in_RDX);
  }
  lj_err_callermsg((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),pcVar1);
}

Assistant:

static void err_argmsg(lua_State *L, int narg,
					    const char *msg)
{
  const char *fname = "?";
  const char *ftype = lj_debug_funcname(L, L->base - 1, &fname);
  if (narg < 0 && narg > LUA_REGISTRYINDEX)
    narg = (int)(L->top - L->base) + narg + 1;
  if (ftype && ftype[3] == 'h' && --narg == 0)  /* Check for "method". */
    msg = lj_strfmt_pushf(L, err2msg(LJ_ERR_BADSELF), fname, msg);
  else
    msg = lj_strfmt_pushf(L, err2msg(LJ_ERR_BADARG), narg, fname, msg);
  lj_err_callermsg(L, msg);
}